

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O2

void ihevc_inter_pred_luma_vert_w16inp_ssse3
               (WORD16 *pi2_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [12];
  long lVar25;
  long lVar26;
  ulong *puVar27;
  int iVar28;
  ulong *puVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [16];
  char cVar35;
  char cVar36;
  char cVar37;
  undefined4 uVar33;
  char cVar38;
  char cVar40;
  char cVar41;
  undefined4 uVar39;
  undefined4 uVar42;
  undefined1 auVar34 [16];
  int iVar43;
  int iVar45;
  int iVar46;
  undefined1 in_XMM4 [16];
  undefined1 auVar44 [16];
  int iVar47;
  undefined2 uVar57;
  undefined2 uVar58;
  undefined2 uVar59;
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar60 [16];
  undefined2 uVar68;
  undefined2 uVar69;
  undefined2 uVar70;
  undefined1 auVar64 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  ulong *local_98;
  ulong *local_90;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  
  uVar1 = *(ulong *)pi1_coeff;
  auVar113[0] = (char)uVar1;
  cVar35 = (char)(uVar1 >> 8);
  cVar36 = (char)(uVar1 >> 0x10);
  cVar37 = (char)(uVar1 >> 0x18);
  cVar38 = (char)(uVar1 >> 0x20);
  cVar40 = (char)(uVar1 >> 0x28);
  cVar41 = (char)(uVar1 >> 0x30);
  auVar44._8_6_ = 0;
  auVar44._0_8_ = uVar1;
  auVar44[0xe] = (char)(uVar1 >> 0x38);
  auVar44[0xf] = -((long)uVar1 < 0);
  auVar52._14_2_ = auVar44._14_2_;
  auVar52._8_5_ = 0;
  auVar52._0_8_ = uVar1;
  auVar52[0xd] = -(cVar41 < '\0');
  auVar79._13_3_ = auVar52._13_3_;
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar1;
  auVar79[0xc] = cVar41;
  auVar112._12_4_ = auVar79._12_4_;
  auVar112._8_3_ = 0;
  auVar112._0_8_ = uVar1;
  auVar112[0xb] = -(cVar40 < '\0');
  auVar119._11_5_ = auVar112._11_5_;
  auVar119._8_2_ = 0;
  auVar119._0_8_ = uVar1;
  auVar119[10] = cVar40;
  auVar96._10_6_ = auVar119._10_6_;
  auVar96[8] = 0;
  auVar96._0_8_ = uVar1;
  auVar96[9] = -(cVar38 < '\0');
  auVar106._9_7_ = auVar96._9_7_;
  auVar106[8] = cVar38;
  auVar106._0_8_ = uVar1;
  auVar24._4_8_ = auVar106._8_8_;
  auVar24[3] = -(cVar37 < '\0');
  auVar24[2] = cVar37;
  auVar24[1] = -(cVar36 < '\0');
  auVar24[0] = cVar36;
  auVar113._4_12_ = auVar24;
  auVar113[3] = -(cVar35 < '\0');
  auVar113[2] = cVar35;
  auVar113[1] = -(auVar113[0] < '\0');
  uVar33 = auVar113._0_4_;
  uVar39 = auVar24._0_4_;
  uVar42 = auVar106._8_4_;
  auVar32._4_4_ = uVar33;
  auVar32._0_4_ = uVar33;
  auVar32._8_4_ = uVar33;
  auVar32._12_4_ = uVar33;
  auVar34._4_4_ = auVar112._12_4_;
  auVar34._0_4_ = auVar112._12_4_;
  auVar34._8_4_ = auVar112._12_4_;
  auVar34._12_4_ = auVar112._12_4_;
  lVar30 = (long)(dst_strd * 2);
  lVar26 = (long)dst_strd;
  lVar25 = (long)(dst_strd * 3);
  local_90 = (ulong *)(pi2_src + src_strd * 8);
  auVar44 = pmovsxbd(in_XMM4,0x20202020);
  local_98 = (ulong *)(pu1_dst + dst_strd * 4);
  for (lVar31 = 0; lVar31 < wd; lVar31 = lVar31 + 4) {
    puVar27 = (ulong *)(pi2_src + lVar31);
    uVar1 = *(ulong *)((long)puVar27 + (long)(src_strd * -3) * 2);
    uVar2 = *(ulong *)((long)puVar27 + (long)(src_strd * -2) * 2);
    uVar58 = (undefined2)(uVar2 >> 0x30);
    auVar51._8_4_ = 0;
    auVar51._0_8_ = uVar1;
    auVar51._12_2_ = (short)(uVar1 >> 0x30);
    auVar51._14_2_ = uVar58;
    auVar50._12_4_ = auVar51._12_4_;
    auVar50._8_2_ = 0;
    auVar50._0_8_ = uVar1;
    uVar57 = (undefined2)(uVar2 >> 0x20);
    auVar50._10_2_ = uVar57;
    auVar49._10_6_ = auVar50._10_6_;
    auVar49._8_2_ = (short)(uVar1 >> 0x20);
    auVar49._0_8_ = uVar1;
    auVar48._8_8_ = auVar49._8_8_;
    uVar68 = (undefined2)(uVar2 >> 0x10);
    auVar48._6_2_ = uVar68;
    auVar48._4_2_ = (short)(uVar1 >> 0x10);
    auVar48._0_2_ = (undefined2)uVar1;
    auVar102._0_2_ = (undefined2)uVar2;
    auVar48._2_2_ = auVar102._0_2_;
    auVar52 = pmaddwd(auVar48,auVar32);
    uVar1 = *(ulong *)((long)puVar27 + (long)-src_strd * 2);
    uVar3 = *puVar27;
    uVar59 = (undefined2)(uVar1 >> 0x30);
    auVar105._8_4_ = 0;
    auVar105._0_8_ = uVar2;
    auVar105._12_2_ = uVar58;
    auVar105._14_2_ = uVar59;
    uVar58 = (undefined2)(uVar1 >> 0x20);
    auVar104._12_4_ = auVar105._12_4_;
    auVar104._8_2_ = 0;
    auVar104._0_8_ = uVar2;
    auVar104._10_2_ = uVar58;
    auVar103._10_6_ = auVar104._10_6_;
    auVar103._8_2_ = uVar57;
    auVar103._0_8_ = uVar2;
    uVar57 = (undefined2)(uVar1 >> 0x10);
    auVar102._8_8_ = auVar103._8_8_;
    auVar102._6_2_ = uVar57;
    auVar102._4_2_ = uVar68;
    auVar102._2_2_ = (short)uVar1;
    uVar69 = (undefined2)(uVar3 >> 0x30);
    auVar74._8_4_ = 0;
    auVar74._0_8_ = uVar1;
    auVar74._12_2_ = uVar59;
    auVar74._14_2_ = uVar69;
    auVar73._12_4_ = auVar74._12_4_;
    auVar73._8_2_ = 0;
    auVar73._0_8_ = uVar1;
    uVar68 = (undefined2)(uVar3 >> 0x20);
    auVar73._10_2_ = uVar68;
    auVar72._10_6_ = auVar73._10_6_;
    auVar72._8_2_ = uVar58;
    auVar72._0_8_ = uVar1;
    auVar71._8_8_ = auVar72._8_8_;
    uVar59 = (undefined2)(uVar3 >> 0x10);
    auVar71._6_2_ = uVar59;
    auVar71._4_2_ = uVar57;
    auVar88._0_2_ = (undefined2)uVar3;
    auVar71._2_2_ = auVar88._0_2_;
    auVar71._0_2_ = (short)uVar1;
    auVar8._4_4_ = uVar39;
    auVar8._0_4_ = uVar39;
    auVar8._8_4_ = uVar39;
    auVar8._12_4_ = uVar39;
    auVar79 = pmaddwd(auVar71,auVar8);
    uVar1 = *(ulong *)((long)puVar27 + (long)src_strd * 2);
    uVar2 = *(ulong *)((long)puVar27 + (long)(src_strd * 2) * 2);
    uVar58 = (undefined2)(uVar1 >> 0x30);
    auVar91._8_4_ = 0;
    auVar91._0_8_ = uVar3;
    auVar91._12_2_ = uVar69;
    auVar91._14_2_ = uVar58;
    uVar57 = (undefined2)(uVar1 >> 0x20);
    auVar90._12_4_ = auVar91._12_4_;
    auVar90._8_2_ = 0;
    auVar90._0_8_ = uVar3;
    auVar90._10_2_ = uVar57;
    auVar89._10_6_ = auVar90._10_6_;
    auVar89._8_2_ = uVar68;
    auVar89._0_8_ = uVar3;
    uVar68 = (undefined2)(uVar1 >> 0x10);
    auVar88._8_8_ = auVar89._8_8_;
    auVar88._6_2_ = uVar68;
    auVar88._4_2_ = uVar59;
    auVar84._0_2_ = (undefined2)uVar1;
    auVar88._2_2_ = auVar84._0_2_;
    uVar59 = (undefined2)(uVar2 >> 0x30);
    auVar87._8_4_ = 0;
    auVar87._0_8_ = uVar1;
    auVar87._12_2_ = uVar58;
    auVar87._14_2_ = uVar59;
    uVar58 = (undefined2)(uVar2 >> 0x20);
    auVar86._12_4_ = auVar87._12_4_;
    auVar86._8_2_ = 0;
    auVar86._0_8_ = uVar1;
    auVar86._10_2_ = uVar58;
    auVar85._10_6_ = auVar86._10_6_;
    auVar85._8_2_ = uVar57;
    auVar85._0_8_ = uVar1;
    uVar57 = (undefined2)(uVar2 >> 0x10);
    auVar84._8_8_ = auVar85._8_8_;
    auVar84._6_2_ = uVar57;
    auVar84._4_2_ = uVar68;
    auVar53._0_2_ = (undefined2)uVar2;
    auVar84._2_2_ = auVar53._0_2_;
    auVar16._4_4_ = uVar42;
    auVar16._0_4_ = uVar42;
    auVar16._8_4_ = uVar42;
    auVar16._12_4_ = uVar42;
    auVar112 = pmaddwd(auVar84,auVar16);
    uVar1 = *(ulong *)((long)puVar27 + (long)(src_strd * 3) * 2);
    uVar3 = *(ulong *)((long)puVar27 + (long)(src_strd * 4) * 2);
    uVar70 = (undefined2)(uVar1 >> 0x30);
    auVar56._8_4_ = 0;
    auVar56._0_8_ = uVar2;
    auVar56._12_2_ = uVar59;
    auVar56._14_2_ = uVar70;
    auVar55._12_4_ = auVar56._12_4_;
    auVar55._8_2_ = 0;
    auVar55._0_8_ = uVar2;
    uVar69 = (undefined2)(uVar1 >> 0x20);
    auVar55._10_2_ = uVar69;
    auVar54._10_6_ = auVar55._10_6_;
    auVar54._8_2_ = uVar58;
    auVar54._0_8_ = uVar2;
    auVar53._8_8_ = auVar54._8_8_;
    uVar68 = (undefined2)(uVar1 >> 0x10);
    auVar53._6_2_ = uVar68;
    auVar53._4_2_ = uVar57;
    auVar64._0_2_ = (undefined2)uVar1;
    auVar53._2_2_ = auVar64._0_2_;
    uVar59 = (undefined2)(uVar3 >> 0x30);
    auVar67._8_4_ = 0;
    auVar67._0_8_ = uVar1;
    auVar67._12_2_ = uVar70;
    auVar67._14_2_ = uVar59;
    uVar58 = (undefined2)(uVar3 >> 0x20);
    auVar66._12_4_ = auVar67._12_4_;
    auVar66._8_2_ = 0;
    auVar66._0_8_ = uVar1;
    auVar66._10_2_ = uVar58;
    auVar65._10_6_ = auVar66._10_6_;
    auVar65._8_2_ = uVar69;
    auVar65._0_8_ = uVar1;
    uVar57 = (undefined2)(uVar3 >> 0x10);
    auVar64._8_8_ = auVar65._8_8_;
    auVar64._6_2_ = uVar57;
    auVar64._4_2_ = uVar68;
    auVar60._0_2_ = (undefined2)uVar3;
    auVar64._2_2_ = auVar60._0_2_;
    auVar119 = pmaddwd(auVar64,auVar34);
    iVar43 = auVar44._0_4_;
    iVar45 = auVar44._4_4_;
    iVar46 = auVar44._8_4_;
    iVar47 = auVar44._12_4_;
    auVar120._0_4_ =
         (auVar119._0_4_ + auVar112._0_4_ + auVar79._0_4_ + auVar52._0_4_ >> 6) + iVar43 >> 6;
    auVar120._4_4_ =
         (auVar119._4_4_ + auVar112._4_4_ + auVar79._4_4_ + auVar52._4_4_ >> 6) + iVar45 >> 6;
    auVar120._8_4_ =
         (auVar119._8_4_ + auVar112._8_4_ + auVar79._8_4_ + auVar52._8_4_ >> 6) + iVar46 >> 6;
    auVar120._12_4_ =
         (auVar119._12_4_ + auVar112._12_4_ + auVar79._12_4_ + auVar52._12_4_ >> 6) + iVar47 >> 6;
    auVar52 = packssdw(auVar120,auVar120);
    sVar4 = auVar52._0_2_;
    sVar5 = auVar52._2_2_;
    sVar6 = auVar52._4_2_;
    sVar7 = auVar52._6_2_;
    *(ulong *)(pu1_dst + lVar31) =
         (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar52[6] - (0xff < sVar7),
                         CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar52[4] - (0xff < sVar6),
                                  CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar52[2] -
                                           (0xff < sVar5),
                                           (0 < sVar4) * (sVar4 < 0x100) * auVar52[0] -
                                           (0xff < sVar4)))) |
         *(ulong *)(pu1_dst + lVar31) & 0xffffffff00000000;
    auVar52 = pmaddwd(auVar71,auVar32);
    auVar9._4_4_ = uVar39;
    auVar9._0_4_ = uVar39;
    auVar9._8_4_ = uVar39;
    auVar9._12_4_ = uVar39;
    auVar79 = pmaddwd(auVar84,auVar9);
    auVar17._4_4_ = uVar42;
    auVar17._0_4_ = uVar42;
    auVar17._8_4_ = uVar42;
    auVar17._12_4_ = uVar42;
    auVar112 = pmaddwd(auVar64,auVar17);
    uVar1 = *(ulong *)((long)puVar27 + (long)(src_strd * 5) * 2);
    uVar2 = *(ulong *)((long)puVar27 + (long)(src_strd * 6) * 2);
    uVar70 = (undefined2)(uVar1 >> 0x30);
    auVar63._8_4_ = 0;
    auVar63._0_8_ = uVar3;
    auVar63._12_2_ = uVar59;
    auVar63._14_2_ = uVar70;
    auVar62._12_4_ = auVar63._12_4_;
    auVar62._8_2_ = 0;
    auVar62._0_8_ = uVar3;
    uVar69 = (undefined2)(uVar1 >> 0x20);
    auVar62._10_2_ = uVar69;
    auVar61._10_6_ = auVar62._10_6_;
    auVar61._8_2_ = uVar58;
    auVar61._0_8_ = uVar3;
    auVar60._8_8_ = auVar61._8_8_;
    uVar68 = (undefined2)(uVar1 >> 0x10);
    auVar60._6_2_ = uVar68;
    auVar60._4_2_ = uVar57;
    auVar80._0_2_ = (undefined2)uVar1;
    auVar60._2_2_ = auVar80._0_2_;
    uVar59 = (undefined2)(uVar2 >> 0x30);
    auVar83._8_4_ = 0;
    auVar83._0_8_ = uVar1;
    auVar83._12_2_ = uVar70;
    auVar83._14_2_ = uVar59;
    uVar58 = (undefined2)(uVar2 >> 0x20);
    auVar82._12_4_ = auVar83._12_4_;
    auVar82._8_2_ = 0;
    auVar82._0_8_ = uVar1;
    auVar82._10_2_ = uVar58;
    auVar81._10_6_ = auVar82._10_6_;
    auVar81._8_2_ = uVar69;
    auVar81._0_8_ = uVar1;
    uVar57 = (undefined2)(uVar2 >> 0x10);
    auVar80._8_8_ = auVar81._8_8_;
    auVar80._6_2_ = uVar57;
    auVar80._4_2_ = uVar68;
    auVar75._0_2_ = (undefined2)uVar2;
    auVar80._2_2_ = auVar75._0_2_;
    auVar119 = pmaddwd(auVar80,auVar34);
    auVar123._0_4_ =
         (auVar119._0_4_ + auVar112._0_4_ + auVar79._0_4_ + auVar52._0_4_ >> 6) + iVar43 >> 6;
    auVar123._4_4_ =
         (auVar119._4_4_ + auVar112._4_4_ + auVar79._4_4_ + auVar52._4_4_ >> 6) + iVar45 >> 6;
    auVar123._8_4_ =
         (auVar119._8_4_ + auVar112._8_4_ + auVar79._8_4_ + auVar52._8_4_ >> 6) + iVar46 >> 6;
    auVar123._12_4_ =
         (auVar119._12_4_ + auVar112._12_4_ + auVar79._12_4_ + auVar52._12_4_ >> 6) + iVar47 >> 6;
    auVar52 = packssdw(auVar123,auVar123);
    sVar4 = auVar52._0_2_;
    sVar5 = auVar52._2_2_;
    sVar6 = auVar52._4_2_;
    sVar7 = auVar52._6_2_;
    *(ulong *)(pu1_dst + lVar30 + lVar31) =
         (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar52[6] - (0xff < sVar7),
                         CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar52[4] - (0xff < sVar6),
                                  CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar52[2] -
                                           (0xff < sVar5),
                                           (0 < sVar4) * (sVar4 < 0x100) * auVar52[0] -
                                           (0xff < sVar4)))) |
         *(ulong *)(pu1_dst + lVar30 + lVar31) & 0xffffffff00000000;
    auVar52 = pmaddwd(auVar102,auVar32);
    auVar10._4_4_ = uVar39;
    auVar10._0_4_ = uVar39;
    auVar10._8_4_ = uVar39;
    auVar10._12_4_ = uVar39;
    auVar112 = pmaddwd(auVar88,auVar10);
    auVar18._4_4_ = uVar42;
    auVar18._0_4_ = uVar42;
    auVar18._8_4_ = uVar42;
    auVar18._12_4_ = uVar42;
    auVar79 = pmaddwd(auVar53,auVar18);
    auVar119 = pmaddwd(auVar60,auVar34);
    auVar121._0_4_ =
         (auVar119._0_4_ + auVar79._0_4_ + auVar112._0_4_ + auVar52._0_4_ >> 6) + iVar43 >> 6;
    auVar121._4_4_ =
         (auVar119._4_4_ + auVar79._4_4_ + auVar112._4_4_ + auVar52._4_4_ >> 6) + iVar45 >> 6;
    auVar121._8_4_ =
         (auVar119._8_4_ + auVar79._8_4_ + auVar112._8_4_ + auVar52._8_4_ >> 6) + iVar46 >> 6;
    auVar121._12_4_ =
         (auVar119._12_4_ + auVar79._12_4_ + auVar112._12_4_ + auVar52._12_4_ >> 6) + iVar47 >> 6;
    auVar52 = packssdw(auVar121,auVar121);
    sVar4 = auVar52._0_2_;
    sVar5 = auVar52._2_2_;
    sVar6 = auVar52._4_2_;
    sVar7 = auVar52._6_2_;
    *(ulong *)(pu1_dst + lVar26 + lVar31) =
         (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar52[6] - (0xff < sVar7),
                         CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar52[4] - (0xff < sVar6),
                                  CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar52[2] -
                                           (0xff < sVar5),
                                           (0 < sVar4) * (sVar4 < 0x100) * auVar52[0] -
                                           (0xff < sVar4)))) |
         *(ulong *)(pu1_dst + lVar26 + lVar31) & 0xffffffff00000000;
    auVar52 = pmaddwd(auVar88,auVar32);
    auVar11._4_4_ = uVar39;
    auVar11._0_4_ = uVar39;
    auVar11._8_4_ = uVar39;
    auVar11._12_4_ = uVar39;
    auVar79 = pmaddwd(auVar53,auVar11);
    auVar19._4_4_ = uVar42;
    auVar19._0_4_ = uVar42;
    auVar19._8_4_ = uVar42;
    auVar19._12_4_ = uVar42;
    auVar112 = pmaddwd(auVar60,auVar19);
    uVar1 = *(ulong *)((long)puVar27 + (long)(src_strd * 7) * 2);
    auVar78._8_4_ = 0;
    auVar78._0_8_ = uVar2;
    auVar78._12_2_ = uVar59;
    auVar78._14_2_ = (short)(uVar1 >> 0x30);
    auVar77._12_4_ = auVar78._12_4_;
    auVar77._8_2_ = 0;
    auVar77._0_8_ = uVar2;
    auVar77._10_2_ = (short)(uVar1 >> 0x20);
    auVar76._10_6_ = auVar77._10_6_;
    auVar76._8_2_ = uVar58;
    auVar76._0_8_ = uVar2;
    auVar75._8_8_ = auVar76._8_8_;
    auVar75._6_2_ = (short)(uVar1 >> 0x10);
    auVar75._4_2_ = uVar57;
    auVar75._2_2_ = (short)uVar1;
    auVar119 = pmaddwd(auVar75,auVar34);
    auVar122._0_4_ =
         (auVar119._0_4_ + auVar112._0_4_ + auVar79._0_4_ + auVar52._0_4_ >> 6) + iVar43 >> 6;
    auVar122._4_4_ =
         (auVar119._4_4_ + auVar112._4_4_ + auVar79._4_4_ + auVar52._4_4_ >> 6) + iVar45 >> 6;
    auVar122._8_4_ =
         (auVar119._8_4_ + auVar112._8_4_ + auVar79._8_4_ + auVar52._8_4_ >> 6) + iVar46 >> 6;
    auVar122._12_4_ =
         (auVar119._12_4_ + auVar112._12_4_ + auVar79._12_4_ + auVar52._12_4_ >> 6) + iVar47 >> 6;
    auVar52 = packssdw(auVar122,auVar122);
    sVar4 = auVar52._0_2_;
    sVar5 = auVar52._2_2_;
    sVar6 = auVar52._4_2_;
    sVar7 = auVar52._6_2_;
    *(ulong *)(pu1_dst + lVar25 + lVar31) =
         (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar52[6] - (0xff < sVar7),
                         CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar52[4] - (0xff < sVar6),
                                  CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar52[2] -
                                           (0xff < sVar5),
                                           (0 < sVar4) * (sVar4 < 0x100) * auVar52[0] -
                                           (0xff < sVar4)))) |
         *(ulong *)(pu1_dst + lVar25 + lVar31) & 0xffffffff00000000;
    puVar27 = local_90;
    puVar29 = local_98;
    for (iVar28 = 4; auVar52 = auVar80, iVar28 < ht; iVar28 = iVar28 + 4) {
      auVar119 = pmaddwd(auVar84,auVar32);
      auVar12._4_4_ = uVar39;
      auVar12._0_4_ = uVar39;
      auVar12._8_4_ = uVar39;
      auVar12._12_4_ = uVar39;
      auVar106 = pmaddwd(auVar64,auVar12);
      auVar20._4_4_ = uVar42;
      auVar20._0_4_ = uVar42;
      auVar20._8_4_ = uVar42;
      auVar20._12_4_ = uVar42;
      auVar112 = pmaddwd(auVar52,auVar20);
      uVar2 = *puVar27;
      uVar58 = (undefined2)(uVar2 >> 0x30);
      auVar95._8_4_ = 0;
      auVar95._0_8_ = uVar1;
      auVar95._12_2_ = (short)(uVar1 >> 0x30);
      auVar95._14_2_ = uVar58;
      auVar94._12_4_ = auVar95._12_4_;
      auVar94._8_2_ = 0;
      auVar94._0_8_ = uVar1;
      uVar57 = (undefined2)(uVar2 >> 0x20);
      auVar94._10_2_ = uVar57;
      auVar93._10_6_ = auVar94._10_6_;
      auVar93._8_2_ = (short)(uVar1 >> 0x20);
      auVar93._0_8_ = uVar1;
      auVar92._8_8_ = auVar93._8_8_;
      uVar68 = (undefined2)(uVar2 >> 0x10);
      auVar92._6_2_ = uVar68;
      auVar92._4_2_ = (short)(uVar1 >> 0x10);
      auVar92._0_2_ = (undefined2)uVar1;
      auVar107._0_2_ = (undefined2)uVar2;
      auVar92._2_2_ = auVar107._0_2_;
      auVar79 = pmaddwd(auVar64,auVar32);
      auVar13._4_4_ = uVar39;
      auVar13._0_4_ = uVar39;
      auVar13._8_4_ = uVar39;
      auVar13._12_4_ = uVar39;
      auVar113 = pmaddwd(auVar52,auVar13);
      auVar96 = pmaddwd(auVar92,auVar34);
      auVar97._0_4_ =
           (auVar96._0_4_ + auVar112._0_4_ + auVar106._0_4_ + auVar119._0_4_ >> 6) + iVar43 >> 6;
      auVar97._4_4_ =
           (auVar96._4_4_ + auVar112._4_4_ + auVar106._4_4_ + auVar119._4_4_ >> 6) + iVar45 >> 6;
      auVar97._8_4_ =
           (auVar96._8_4_ + auVar112._8_4_ + auVar106._8_4_ + auVar119._8_4_ >> 6) + iVar46 >> 6;
      auVar97._12_4_ =
           (auVar96._12_4_ + auVar112._12_4_ + auVar106._12_4_ + auVar119._12_4_ >> 6) + iVar47 >> 6
      ;
      auVar112 = packssdw(auVar97,auVar97);
      sVar4 = auVar112._0_2_;
      sVar5 = auVar112._2_2_;
      sVar6 = auVar112._4_2_;
      sVar7 = auVar112._6_2_;
      *puVar29 = (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar112[6] - (0xff < sVar7),
                                 CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar112[4] -
                                          (0xff < sVar6),
                                          CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar112[2] -
                                                   (0xff < sVar5),
                                                   (0 < sVar4) * (sVar4 < 0x100) * auVar112[0] -
                                                   (0xff < sVar4)))) | *puVar29 & 0xffffffff00000000
      ;
      auVar21._4_4_ = uVar42;
      auVar21._0_4_ = uVar42;
      auVar21._8_4_ = uVar42;
      auVar21._12_4_ = uVar42;
      auVar119 = pmaddwd(auVar92,auVar21);
      uVar1 = *(ulong *)((long)puVar27 + (long)src_strd * 2);
      uVar3 = *(ulong *)((long)puVar27 + (long)(src_strd * 2) * 2);
      uVar59 = (undefined2)(uVar1 >> 0x30);
      auVar110._8_4_ = 0;
      auVar110._0_8_ = uVar2;
      auVar110._12_2_ = uVar58;
      auVar110._14_2_ = uVar59;
      uVar58 = (undefined2)(uVar1 >> 0x20);
      auVar109._12_4_ = auVar110._12_4_;
      auVar109._8_2_ = 0;
      auVar109._0_8_ = uVar2;
      auVar109._10_2_ = uVar58;
      auVar108._10_6_ = auVar109._10_6_;
      auVar108._8_2_ = uVar57;
      auVar108._0_8_ = uVar2;
      uVar57 = (undefined2)(uVar1 >> 0x10);
      auVar107._8_8_ = auVar108._8_8_;
      auVar107._6_2_ = uVar57;
      auVar107._4_2_ = uVar68;
      auVar107._2_2_ = (short)uVar1;
      uVar68 = (undefined2)(uVar3 >> 0x30);
      auVar100._8_4_ = 0;
      auVar100._0_8_ = uVar1;
      auVar100._12_2_ = uVar59;
      auVar100._14_2_ = uVar68;
      auVar99._12_4_ = auVar100._12_4_;
      auVar99._8_2_ = 0;
      auVar99._0_8_ = uVar1;
      uVar59 = (undefined2)(uVar3 >> 0x20);
      auVar99._10_2_ = uVar59;
      auVar98._10_6_ = auVar99._10_6_;
      auVar98._8_2_ = uVar58;
      auVar98._0_8_ = uVar1;
      auVar80._8_8_ = auVar98._8_8_;
      uVar58 = (undefined2)(uVar3 >> 0x10);
      auVar80._6_2_ = uVar58;
      auVar80._4_2_ = uVar57;
      auVar114._0_2_ = (undefined2)uVar3;
      auVar80._2_2_ = auVar114._0_2_;
      auVar80._0_2_ = (short)uVar1;
      auVar112 = pmaddwd(auVar80,auVar34);
      auVar101._0_4_ =
           (auVar112._0_4_ + auVar119._0_4_ + auVar113._0_4_ + auVar79._0_4_ >> 6) + iVar43 >> 6;
      auVar101._4_4_ =
           (auVar112._4_4_ + auVar119._4_4_ + auVar113._4_4_ + auVar79._4_4_ >> 6) + iVar45 >> 6;
      auVar101._8_4_ =
           (auVar112._8_4_ + auVar119._8_4_ + auVar113._8_4_ + auVar79._8_4_ >> 6) + iVar46 >> 6;
      auVar101._12_4_ =
           (auVar112._12_4_ + auVar119._12_4_ + auVar113._12_4_ + auVar79._12_4_ >> 6) + iVar47 >> 6
      ;
      auVar79 = packssdw(auVar101,auVar101);
      sVar4 = auVar79._0_2_;
      sVar5 = auVar79._2_2_;
      sVar6 = auVar79._4_2_;
      sVar7 = auVar79._6_2_;
      *(ulong *)((long)puVar29 + lVar30) =
           (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar79[6] - (0xff < sVar7),
                           CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar79[4] - (0xff < sVar6),
                                    CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar79[2] -
                                             (0xff < sVar5),
                                             (0 < sVar4) * (sVar4 < 0x100) * auVar79[0] -
                                             (0xff < sVar4)))) |
           *(ulong *)((long)puVar29 + lVar30) & 0xffffffff00000000;
      auVar79 = pmaddwd(auVar53,auVar32);
      auVar14._4_4_ = uVar39;
      auVar14._0_4_ = uVar39;
      auVar14._8_4_ = uVar39;
      auVar14._12_4_ = uVar39;
      auVar96 = pmaddwd(auVar60,auVar14);
      auVar22._4_4_ = uVar42;
      auVar22._0_4_ = uVar42;
      auVar22._8_4_ = uVar42;
      auVar22._12_4_ = uVar42;
      auVar119 = pmaddwd(auVar75,auVar22);
      auVar112 = pmaddwd(auVar60,auVar32);
      auVar15._4_4_ = uVar39;
      auVar15._0_4_ = uVar39;
      auVar15._8_4_ = uVar39;
      auVar15._12_4_ = uVar39;
      auVar113 = pmaddwd(auVar75,auVar15);
      auVar106 = pmaddwd(auVar107,auVar34);
      auVar111._0_4_ =
           (auVar106._0_4_ + auVar119._0_4_ + auVar96._0_4_ + auVar79._0_4_ >> 6) + iVar43 >> 6;
      auVar111._4_4_ =
           (auVar106._4_4_ + auVar119._4_4_ + auVar96._4_4_ + auVar79._4_4_ >> 6) + iVar45 >> 6;
      auVar111._8_4_ =
           (auVar106._8_4_ + auVar119._8_4_ + auVar96._8_4_ + auVar79._8_4_ >> 6) + iVar46 >> 6;
      auVar111._12_4_ =
           (auVar106._12_4_ + auVar119._12_4_ + auVar96._12_4_ + auVar79._12_4_ >> 6) + iVar47 >> 6;
      auVar79 = packssdw(auVar111,auVar111);
      sVar4 = auVar79._0_2_;
      sVar5 = auVar79._2_2_;
      sVar6 = auVar79._4_2_;
      sVar7 = auVar79._6_2_;
      *(ulong *)((long)puVar29 + lVar26) =
           (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar79[6] - (0xff < sVar7),
                           CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar79[4] - (0xff < sVar6),
                                    CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar79[2] -
                                             (0xff < sVar5),
                                             (0 < sVar4) * (sVar4 < 0x100) * auVar79[0] -
                                             (0xff < sVar4)))) |
           *(ulong *)((long)puVar29 + lVar26) & 0xffffffff00000000;
      auVar23._4_4_ = uVar42;
      auVar23._0_4_ = uVar42;
      auVar23._8_4_ = uVar42;
      auVar23._12_4_ = uVar42;
      auVar119 = pmaddwd(auVar107,auVar23);
      uVar1 = *(ulong *)((long)puVar27 + (long)(src_strd * 3) * 2);
      auVar117._8_4_ = 0;
      auVar117._0_8_ = uVar3;
      auVar117._12_2_ = uVar68;
      auVar117._14_2_ = (short)(uVar1 >> 0x30);
      auVar116._12_4_ = auVar117._12_4_;
      auVar116._8_2_ = 0;
      auVar116._0_8_ = uVar3;
      auVar116._10_2_ = (short)(uVar1 >> 0x20);
      auVar115._10_6_ = auVar116._10_6_;
      auVar115._8_2_ = uVar59;
      auVar115._0_8_ = uVar3;
      auVar114._8_8_ = auVar115._8_8_;
      auVar114._6_2_ = (short)(uVar1 >> 0x10);
      auVar114._4_2_ = uVar58;
      auVar114._2_2_ = (short)uVar1;
      auVar79 = pmaddwd(auVar114,auVar34);
      auVar118._0_4_ =
           (auVar79._0_4_ + auVar119._0_4_ + auVar113._0_4_ + auVar112._0_4_ >> 6) + iVar43 >> 6;
      auVar118._4_4_ =
           (auVar79._4_4_ + auVar119._4_4_ + auVar113._4_4_ + auVar112._4_4_ >> 6) + iVar45 >> 6;
      auVar118._8_4_ =
           (auVar79._8_4_ + auVar119._8_4_ + auVar113._8_4_ + auVar112._8_4_ >> 6) + iVar46 >> 6;
      auVar118._12_4_ =
           (auVar79._12_4_ + auVar119._12_4_ + auVar113._12_4_ + auVar112._12_4_ >> 6) + iVar47 >> 6
      ;
      auVar79 = packssdw(auVar118,auVar118);
      sVar4 = auVar79._0_2_;
      sVar5 = auVar79._2_2_;
      sVar6 = auVar79._4_2_;
      sVar7 = auVar79._6_2_;
      *(ulong *)((long)puVar29 + lVar25) =
           (ulong)CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar79[6] - (0xff < sVar7),
                           CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar79[4] - (0xff < sVar6),
                                    CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar79[2] -
                                             (0xff < sVar5),
                                             (0 < sVar4) * (sVar4 < 0x100) * auVar79[0] -
                                             (0xff < sVar4)))) |
           *(ulong *)((long)puVar29 + lVar25) & 0xffffffff00000000;
      puVar29 = (ulong *)((long)puVar29 + (long)(dst_strd * 4));
      puVar27 = (ulong *)((long)puVar27 + (long)(src_strd * 4) * 2);
      auVar53 = auVar75;
      auVar60 = auVar107;
      auVar64 = auVar92;
      auVar75 = auVar114;
      auVar84 = auVar52;
    }
    local_98 = (ulong *)((long)local_98 + 4);
    local_90 = local_90 + 1;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16inp_ssse3(WORD16 *pi2_src,
                                             UWORD8 *pu1_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    WORD16 *pi2_src_copy;
    UWORD8 *pu1_dst_copy;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i s0_8x16b, s1_8x16b, s2_8x16b, s3_8x16b, s4_8x16b, s5_8x16b, s6_8x16b, s8_8x16b, s9_8x16b;
    __m128i s2_0_16x8b, s2_1_16x8b, s2_2_16x8b, s2_3_16x8b, s2_4_16x8b, s2_5_16x8b, s2_6_16x8b, s2_7_16x8b, s2_8_16x8b, s2_9_16x8b, s2_10_16x8b;
    __m128i s3_0_16x8b, s3_1_16x8b, s3_2_16x8b, s3_3_16x8b, s3_4_16x8b;
    __m128i s4_0_16x8b, s4_1_16x8b, s4_2_16x8b, s4_3_16x8b, s4_4_16x8b;
    __m128i s10_8x16b, s11_8x16b, s12_8x16b, s13_8x16b, s14_8x16b, s15_8x16b, s16_8x16b, s18_8x16b, s19_8x16b;
    __m128i s20_8x16b, s21_8x16b, s22_8x16b, s23_8x16b, s24_8x16b, s25_8x16b, s26_8x16b, s28_8x16b, s29_8x16b;
    __m128i s30_8x16b, s31_8x16b, s32_8x16b, s33_8x16b, s34_8x16b, s35_8x16b, s36_8x16b, s38_8x16b, s39_8x16b;

    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b, sign_reg;

/* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    s4_8x16b = _mm_loadl_epi64((__m128i *)pi1_coeff);

    zero_8x16b = _mm_setzero_si128();
    sign_reg =  _mm_cmpgt_epi8(zero_8x16b, s4_8x16b);
    s5_8x16b  = _mm_unpacklo_epi8(s4_8x16b, sign_reg);

    coeff0_1_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(0, 0, 0, 0));  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(1, 1, 1, 1));  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(2, 2, 2, 2));  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi32(s5_8x16b, _MM_SHUFFLE(3, 3, 3, 3));  /* pi1_coeff[4] */


/* seting values in register */
    offset_8x16b = _mm_set1_epi32(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */
    mask_low_32b = _mm_set_epi32(0xFFFFFFFF, 0xFFFFFFFF, 0xFFFFFFFF, 0x00000000);
    mask_high_96b = _mm_set_epi32(0x00000000, 0x00000000, 0x00000000, 0xFFFFFFFF);


    pi2_src_copy = pi2_src;
    pu1_dst_copy = pu1_dst;

/*  outer for loop starts from here */
    for(col = 0; col < wd; col += 4)
    {

        pi2_src = pi2_src_copy + col;
        pu1_dst = pu1_dst_copy + col;

        /*load 4 pixel values */
        s2_0_16x8b  = _mm_loadl_epi64((__m128i *)(pi2_src + (-3 * src_strd)));

        /*load 4 pixel values */
        s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (-2 * src_strd)));

        s3_0_16x8b = _mm_unpacklo_epi16(s2_0_16x8b, s2_1_16x8b);

        s0_8x16b = _mm_madd_epi16(s3_0_16x8b, coeff0_1_8x16b);

        /*load 4 pixel values */
        s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (-1 * src_strd)));

        /*load 4 pixel values */
        s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (0 * src_strd)));

        s3_1_16x8b = _mm_unpacklo_epi16(s2_2_16x8b, s2_3_16x8b);

        s1_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff2_3_8x16b);

        /*load 4 pixel values */
        s2_4_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (1 * src_strd)));

        /*load 4 pixel values */
        s2_5_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

        s3_2_16x8b = _mm_unpacklo_epi16(s2_4_16x8b, s2_5_16x8b);

        s2_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_6_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

        /*load 4 pixel values */
        s2_7_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (4 * src_strd)));

        s3_3_16x8b = _mm_unpacklo_epi16(s2_6_16x8b, s2_7_16x8b);

        s3_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff6_7_8x16b);

        s4_8x16b = _mm_add_epi32(s0_8x16b, s1_8x16b);
        s5_8x16b = _mm_add_epi32(s2_8x16b, s3_8x16b);
        s6_8x16b = _mm_add_epi32(s4_8x16b, s5_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s8_8x16b = _mm_srai_epi32(s6_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s9_8x16b = _mm_add_epi32(s8_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s8_8x16b = _mm_srai_epi32(s9_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s8_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s9_8x16b = _mm_packus_epi16(s8_8x16b, zero_8x16b);

        s4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
        s5_8x16b =  _mm_and_si128(s4_8x16b, mask_low_32b);
        s6_8x16b =  _mm_and_si128(s9_8x16b, mask_high_96b);
        s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 0*/
        _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

        /* ROW 2*/
        s20_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff0_1_8x16b);
        s21_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff2_3_8x16b);
        s22_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_8_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (5 * src_strd)));

        /*load 4 pixel values */
        s2_9_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (6 * src_strd)));

        s3_4_16x8b = _mm_unpacklo_epi16(s2_8_16x8b, s2_9_16x8b);

        s23_8x16b = _mm_madd_epi16(s3_4_16x8b, coeff6_7_8x16b);

        s24_8x16b = _mm_add_epi32(s20_8x16b, s21_8x16b);
        s25_8x16b = _mm_add_epi32(s22_8x16b, s23_8x16b);
        s26_8x16b = _mm_add_epi32(s24_8x16b, s25_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s28_8x16b = _mm_srai_epi32(s26_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s29_8x16b = _mm_add_epi32(s28_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s28_8x16b = _mm_srai_epi32(s29_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s28_8x16b = _mm_packs_epi32(s28_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s29_8x16b = _mm_packus_epi16(s28_8x16b, zero_8x16b);

        s24_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (2 * dst_strd)));
        s25_8x16b =  _mm_and_si128(s24_8x16b, mask_low_32b);
        s26_8x16b =  _mm_and_si128(s29_8x16b, mask_high_96b);
        s29_8x16b = _mm_or_si128(s25_8x16b, s26_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 2*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), s29_8x16b);


        /*ROW 1*/
        s4_0_16x8b = _mm_unpacklo_epi16(s2_1_16x8b, s2_2_16x8b);

        s10_8x16b = _mm_madd_epi16(s4_0_16x8b, coeff0_1_8x16b);

        s4_1_16x8b = _mm_unpacklo_epi16(s2_3_16x8b, s2_4_16x8b);

        s11_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff2_3_8x16b);

        s4_2_16x8b = _mm_unpacklo_epi16(s2_5_16x8b, s2_6_16x8b);

        s12_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff4_5_8x16b);

        s4_3_16x8b = _mm_unpacklo_epi16(s2_7_16x8b, s2_8_16x8b);

        s13_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff6_7_8x16b);

        s14_8x16b = _mm_add_epi32(s10_8x16b, s11_8x16b);
        s15_8x16b = _mm_add_epi32(s12_8x16b, s13_8x16b);
        s16_8x16b = _mm_add_epi32(s14_8x16b, s15_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s18_8x16b = _mm_srai_epi32(s16_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s19_8x16b = _mm_add_epi32(s18_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s18_8x16b = _mm_srai_epi32(s19_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s18_8x16b = _mm_packs_epi32(s18_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s19_8x16b = _mm_packus_epi16(s18_8x16b, zero_8x16b);

        s14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (dst_strd)));
        s15_8x16b =  _mm_and_si128(s14_8x16b, mask_low_32b);
        s16_8x16b =  _mm_and_si128(s19_8x16b, mask_high_96b);
        s19_8x16b = _mm_or_si128(s15_8x16b, s16_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 1*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (dst_strd)), s19_8x16b);


        /* ROW 3*/
        s30_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff0_1_8x16b);
        s31_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff2_3_8x16b);
        s32_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff4_5_8x16b);

        /*load 4 pixel values */
        s2_10_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (7 * src_strd)));

        s4_4_16x8b = _mm_unpacklo_epi16(s2_9_16x8b, s2_10_16x8b);

        s33_8x16b = _mm_madd_epi16(s4_4_16x8b, coeff6_7_8x16b);

        s34_8x16b = _mm_add_epi32(s30_8x16b, s31_8x16b);
        s35_8x16b = _mm_add_epi32(s32_8x16b, s33_8x16b);
        s36_8x16b = _mm_add_epi32(s34_8x16b, s35_8x16b);

        /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s38_8x16b = _mm_srai_epi32(s36_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);


        /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
        s39_8x16b = _mm_add_epi32(s38_8x16b, offset_8x16b);

        /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
        s38_8x16b = _mm_srai_epi32(s39_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

        s38_8x16b = _mm_packs_epi32(s38_8x16b, zero_8x16b);


        /* i2_tmp = CLIP_U8(i2_tmp);*/
        s39_8x16b = _mm_packus_epi16(s38_8x16b, zero_8x16b);

        s34_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (3 * dst_strd)));
        s35_8x16b =  _mm_and_si128(s34_8x16b, mask_low_32b);
        s36_8x16b =  _mm_and_si128(s39_8x16b, mask_high_96b);
        s39_8x16b = _mm_or_si128(s35_8x16b, s36_8x16b);

        /* store 8 8-bit output values  */
        /* Store the output pixels of row 2*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), s39_8x16b);

        pi2_src += (8 * src_strd);
        pu1_dst += (4 * dst_strd);

        for(row = 4; row < ht; row += 4)
        {

            s3_0_16x8b = s3_2_16x8b;
            s3_1_16x8b = s3_3_16x8b;
            s3_2_16x8b = s3_4_16x8b;

            s0_8x16b = _mm_madd_epi16(s3_0_16x8b, coeff0_1_8x16b);
            s1_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff2_3_8x16b);
            s2_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 4)th row*/
            s2_0_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src));

            s3_3_16x8b = _mm_unpacklo_epi16(s2_10_16x8b, s2_0_16x8b);
            s3_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff6_7_8x16b);

            s4_0_16x8b = s4_2_16x8b;
            s4_1_16x8b = s4_3_16x8b;
            s4_2_16x8b = s4_4_16x8b;

            s4_8x16b = _mm_add_epi32(s0_8x16b, s1_8x16b);
            s5_8x16b = _mm_add_epi32(s2_8x16b, s3_8x16b);
            s6_8x16b = _mm_add_epi32(s4_8x16b, s5_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s8_8x16b = _mm_srai_epi32(s6_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s9_8x16b = _mm_add_epi32(s8_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s8_8x16b = _mm_srai_epi32(s9_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s8_8x16b = _mm_packs_epi32(s8_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s9_8x16b = _mm_packus_epi16(s8_8x16b, zero_8x16b);

            s4_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst));
            s5_8x16b =  _mm_and_si128(s4_8x16b, mask_low_32b);
            s6_8x16b =  _mm_and_si128(s9_8x16b, mask_high_96b);
            s9_8x16b = _mm_or_si128(s5_8x16b, s6_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of row 4*/
            _mm_storel_epi64((__m128i *)(pu1_dst), s9_8x16b);

/* row + 2*/
            s20_8x16b = _mm_madd_epi16(s3_1_16x8b, coeff0_1_8x16b);
            s21_8x16b = _mm_madd_epi16(s3_2_16x8b, coeff2_3_8x16b);
            s22_8x16b = _mm_madd_epi16(s3_3_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 5)th row*/
            s2_1_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + src_strd));

            /*load 4 pixel values from (cur_row + 6)th row*/
            s2_2_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (2 * src_strd)));

            /*unpacking (cur_row + 5)th row and (cur_row + 6)th row*/
            s3_4_16x8b = _mm_unpacklo_epi16(s2_1_16x8b, s2_2_16x8b);

            s23_8x16b = _mm_madd_epi16(s3_4_16x8b, coeff6_7_8x16b);

            s24_8x16b = _mm_add_epi32(s20_8x16b, s21_8x16b);
            s25_8x16b = _mm_add_epi32(s22_8x16b, s23_8x16b);
            s26_8x16b = _mm_add_epi32(s24_8x16b, s25_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s28_8x16b = _mm_srai_epi32(s26_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s29_8x16b = _mm_add_epi32(s28_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s28_8x16b = _mm_srai_epi32(s29_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s28_8x16b = _mm_packs_epi32(s28_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s29_8x16b = _mm_packus_epi16(s28_8x16b, zero_8x16b);

            s24_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (2 * dst_strd)));
            s25_8x16b =  _mm_and_si128(s24_8x16b, mask_low_32b);
            s26_8x16b =  _mm_and_si128(s29_8x16b, mask_high_96b);
            s29_8x16b = _mm_or_si128(s25_8x16b, s26_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row+2)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), s29_8x16b);


/*row + 1*/
            s10_8x16b = _mm_madd_epi16(s4_0_16x8b, coeff0_1_8x16b);
            s11_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff2_3_8x16b);
            s12_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff4_5_8x16b);

            /*unpacking (cur_row + 4)th row and (cur_row + 5)th row*/
            s4_3_16x8b = _mm_unpacklo_epi16(s2_0_16x8b, s2_1_16x8b);
            s13_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff6_7_8x16b);

            s14_8x16b = _mm_add_epi32(s10_8x16b, s11_8x16b);
            s15_8x16b = _mm_add_epi32(s12_8x16b, s13_8x16b);
            s16_8x16b = _mm_add_epi32(s14_8x16b, s15_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s18_8x16b = _mm_srai_epi32(s16_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s19_8x16b = _mm_add_epi32(s18_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s18_8x16b = _mm_srai_epi32(s19_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s18_8x16b = _mm_packs_epi32(s18_8x16b, zero_8x16b);

            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s19_8x16b = _mm_packus_epi16(s18_8x16b, zero_8x16b);

            s14_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd));
            s15_8x16b =  _mm_and_si128(s14_8x16b, mask_low_32b);
            s16_8x16b =  _mm_and_si128(s19_8x16b, mask_high_96b);
            s19_8x16b = _mm_or_si128(s15_8x16b, s16_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row + 1)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd), s19_8x16b);


/* row + 3*/
            s30_8x16b = _mm_madd_epi16(s4_1_16x8b, coeff0_1_8x16b);
            s31_8x16b = _mm_madd_epi16(s4_2_16x8b, coeff2_3_8x16b);
            s32_8x16b = _mm_madd_epi16(s4_3_16x8b, coeff4_5_8x16b);

            /*load 4 pixel values from (cur_row + 7)th row*/
            s2_3_16x8b = _mm_loadl_epi64((__m128i *)(pi2_src + (3 * src_strd)));

            /*unpacking (cur_row + 6)th row and (cur_row + 7)th row*/
            s4_4_16x8b = _mm_unpacklo_epi16(s2_2_16x8b, s2_3_16x8b);

            s33_8x16b = _mm_madd_epi16(s4_4_16x8b, coeff6_7_8x16b);

            s34_8x16b = _mm_add_epi32(s30_8x16b, s31_8x16b);
            s35_8x16b = _mm_add_epi32(s32_8x16b, s33_8x16b);
            s36_8x16b = _mm_add_epi32(s34_8x16b, s35_8x16b);

            /*(i2_tmp + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s38_8x16b = _mm_srai_epi32(s36_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            /* (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) */
            s39_8x16b = _mm_add_epi32(s38_8x16b, offset_8x16b);

            /* i4_tmp = ((i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) + OFFSET_14_MINUS_BIT_DEPTH) >> SHIFT_14_MINUS_BIT_DEPTH */
            s38_8x16b = _mm_srai_epi32(s39_8x16b,  SHIFT_14_MINUS_BIT_DEPTH);

            s38_8x16b = _mm_packs_epi32(s38_8x16b, zero_8x16b);


            /* i2_tmp = CLIP_U8(i2_tmp);*/
            s39_8x16b = _mm_packus_epi16(s38_8x16b, zero_8x16b);

            s34_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + (3 * dst_strd)));
            s35_8x16b =  _mm_and_si128(s34_8x16b, mask_low_32b);
            s36_8x16b =  _mm_and_si128(s39_8x16b, mask_high_96b);
            s39_8x16b = _mm_or_si128(s35_8x16b, s36_8x16b);

            /* store 8 8-bit output values  */
            /* Store the output pixels of (cur_row+3)*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), s39_8x16b);

            s2_10_16x8b = s2_3_16x8b;

            pi2_src += 4 * src_strd; /* pointer update */
            pu1_dst += 4 * dst_strd; /* pointer update */
        }
    }

}